

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

vm_obj_id_t CVmObjByteArray::create_from_string(vm_val_t *strval,char *str,vm_val_t *mapval)

{
  CVmObjPageEntry *pCVar1;
  wchar_t wVar2;
  vm_obj_id_t vVar3;
  size_t sVar4;
  ulong len;
  ulong uVar5;
  size_t out_idx;
  ulong uVar6;
  unsigned_long idx;
  char *src;
  vm_obj_id_t local_154;
  utf8_ptr p;
  ulong local_148;
  CCharmapToLocal *local_140;
  uchar buf [256];
  
  uVar5 = (ulong)*(ushort *)str;
  src = str + 2;
  local_148 = uVar5;
  if ((mapval == (vm_val_t *)0x0) || (mapval->typ == VM_NIL)) {
    p.p_ = src;
    sVar4 = utf8_ptr::s_len(src,uVar5);
    local_154 = create(0,sVar4);
    pCVar1 = G_obj_table_X.pages_[local_154 >> 0xc];
    uVar6 = 1;
    while (uVar5 != 0) {
      uVar5 = 1;
      for (len = 0; (uVar5 != 0 && (len < 0x100)); len = len + 1) {
        wVar2 = utf8_ptr::s_getch(p.p_);
        if (L'ÿ' < wVar2) {
          err_throw(0x7e7);
        }
        buf[len] = (uchar)wVar2;
        utf8_ptr::inc(&p,&local_148);
        uVar5 = local_148;
      }
      copy_from_buf((CVmObjByteArray *)(pCVar1 + (local_154 & 0xfff)),buf,(long)(int)uVar6,len);
      uVar6 = (long)(int)uVar6 + len;
      uVar5 = local_148;
    }
  }
  else {
    vVar3 = CVmBif::get_charset_obj(mapval);
    local_140 = CVmObjCharSet::get_to_local
                          ((CVmObjCharSet *)(G_obj_table_X.pages_[vVar3 >> 0xc] + (vVar3 & 0xfff)));
    sVar4 = CCharmapToLocal::map_utf8(local_140,(char *)0x0,0,src,uVar5,(size_t *)&p);
    local_154 = create(0,sVar4);
    pCVar1 = G_obj_table_X.pages_[local_154 >> 0xc];
    idx = 1;
    for (; uVar5 != 0; uVar5 = uVar5 - (long)p.p_) {
      sVar4 = CCharmapToLocal::map_utf8(local_140,(char *)buf,0x80,src,uVar5,(size_t *)&p);
      copy_from_buf((CVmObjByteArray *)(pCVar1 + (local_154 & 0xfff)),buf,idx,sVar4);
      idx = idx + sVar4;
      src = src + p.p_;
    }
  }
  return local_154;
}

Assistant:

vm_obj_id_t CVmObjByteArray::create_from_string(
    VMG_ const vm_val_t *strval, const char *str, const vm_val_t *mapval)
{
    /* we can't allocate our object until we know the mapped byte count */
    vm_obj_id_t id = VM_INVALID_OBJ;
    CVmObjByteArray *arr = 0;
    
    /* get the string's length and skip the length prefix */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /*
     *   We have two modes: map to bytes via a character set, or stuff
     *   unmapped character values into bytes.  Check which mode we're using.
     */
    if (mapval == 0 || mapval->typ == VM_NIL)
    {
        /* 
         *   No character mapper - just stuff each character into a byte.  If
         *   a character is outside the 0..255 range, it's an error.  
         */

        /* count the number of characters */
        utf8_ptr p((char *)str);
        size_t clen = p.len(len);

        /* allocate the array - each string character is one array byte */
        id = create(vmg_ FALSE, clen);
        arr = (CVmObjByteArray *)vm_objp(vmg_ id);

        /* copy bytes into the array */
        for (int idx = 1 ; len != 0 ; )
        {
            /* translate a buffer-full */
            unsigned char buf[256];
            size_t cur = 0;
            for ( ; len != 0 && cur < sizeof(buf) ; p.inc(&len))
            {
                /* get the next character; make sure it fits in a byte */
                wchar_t ch = p.getch();
                if (ch > 255)
                    err_throw(VMERR_NUM_OVERFLOW);
                
                /* save it */
                buf[cur++] = (unsigned char)ch;
            }
            
            /* copy this chunk to the array */
            arr->cons_copy_from_buf(buf, idx, cur);
            idx += cur;
        }
    }
    else
    {
        /* interpret the character set argument */
        vm_obj_id_t mapid = CVmBif::get_charset_obj(vmg_ mapval);

        /* get the to-local mapping from the character set */
        CCharmapToLocal *mapper =
            ((CVmObjCharSet *)vm_objp(vmg_ mapid))->get_to_local(vmg0_);

        /* 
         *   first, do a mapping with a null output buffer to determine how
         *   many bytes we need for the mapping 
         */
        size_t src_bytes_used;
        size_t byte_len = mapper->map_utf8(0, 0, str, len, &src_bytes_used);
        
        /* allocate a new ByteArray with the required number of bytes */
        id = CVmObjByteArray::create(vmg_ FALSE, byte_len);
        arr = (CVmObjByteArray *)vm_objp(vmg_ id);
        
        /* convert it again, this time storing the bytes */
        for (size_t out_idx = 1 ; len != 0 ; )
        {
            char buf[128];
            
            /* convert a buffer-full */
            byte_len = mapper->map_utf8(buf, sizeof(buf), str, len,
                                        &src_bytes_used);
            
            /* store the bytes in the byte array */
            arr->cons_copy_from_buf((unsigned char *)buf, out_idx, byte_len);
            
            /* advance past the output bytes we used */
            out_idx += byte_len;
            
            /* advance past the source bytes we used */
            str += src_bytes_used;
            len -= src_bytes_used;
        }
    }

    /* return the new array's object ID */
    return id;
}